

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void CheckApplet(TidyDocImpl *doc,Node *node)

{
  long lVar1;
  char cVar2;
  uint uVar3;
  AttVal *pAVar4;
  Node *pNVar5;
  Lexer *pLVar6;
  bool bVar7;
  bool bVar8;
  Bool BVar9;
  ulong uVar10;
  ctmbstr cp;
  tmbchar *ptVar11;
  
  if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) {
    return;
  }
  bVar8 = false;
  for (pAVar4 = node->attributes; pAVar4 != (AttVal *)0x0; pAVar4 = pAVar4->next) {
    if (((pAVar4->dict != (Attribute *)0x0) && (pAVar4->dict->id == TidyAttr_ALT)) &&
       (pAVar4->value != (tmbstr)0x0)) {
      bVar8 = true;
    }
  }
  if ((!bVar8) && (pNVar5 = node->content, pNVar5 != (Node *)0x0)) {
    if (pNVar5->tag == (Dict *)0x0) {
      ptVar11 = (doc->access).text;
      uVar3 = pNVar5->start;
      if (uVar3 < pNVar5->end) {
        pLVar6 = doc->lexer;
        uVar10 = 0;
        do {
          ptVar11[uVar10] = pLVar6->lexbuf[uVar10 + uVar3];
          if (uVar10 == 0x7f) {
            uVar10 = 0x7f;
            break;
          }
          lVar1 = uVar3 + uVar10;
          uVar10 = uVar10 + 1;
        } while (lVar1 + 1U < (ulong)pNVar5->end);
        uVar10 = uVar10 & 0xffffffff;
      }
      else {
        uVar10 = 0;
      }
      ptVar11[uVar10] = '\0';
    }
    else {
      ptVar11 = (tmbchar *)0x0;
    }
    pNVar5 = node->content->content;
    if ((pNVar5 != (Node *)0x0) && (pNVar5->tag == (Dict *)0x0)) {
      ptVar11 = (doc->access).text;
      uVar3 = pNVar5->start;
      if (uVar3 < pNVar5->end) {
        pLVar6 = doc->lexer;
        uVar10 = 0;
        do {
          ptVar11[uVar10] = pLVar6->lexbuf[uVar10 + uVar3];
          if (uVar10 == 0x7f) {
            uVar10 = 0x7f;
            break;
          }
          lVar1 = uVar3 + uVar10;
          uVar10 = uVar10 + 1;
        } while (lVar1 + 1U < (ulong)pNVar5->end);
        uVar10 = uVar10 & 0xffffffff;
      }
      else {
        uVar10 = 0;
      }
      ptVar11[uVar10] = '\0';
    }
    if (ptVar11 != (tmbchar *)0x0) {
      do {
        cVar2 = *ptVar11;
        bVar7 = cVar2 != '\0';
        if (cVar2 == '\0') break;
        BVar9 = prvTidyIsWhite((int)cVar2);
        ptVar11 = ptVar11 + 1;
      } while (BVar9 != no);
      goto LAB_001549e7;
    }
  }
  bVar7 = false;
LAB_001549e7:
  if ((!bVar7) && (!bVar8)) {
    prvTidyReportAccessError(doc,node,0x29d);
    return;
  }
  return;
}

Assistant:

static void CheckApplet( TidyDocImpl* doc, Node* node )
{
    Bool HasAlt = no;
    Bool HasDescription = no;

    AttVal* av;
        
    if (Level1_Enabled( doc ))
    {
        /* Checks for attributes within the APPLET element */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            /*
               Checks for valid ALT attribute.
               The length of the alt text must be > 4 characters in length
               but must be < 150 characters long.
            */

            if ( attrIsALT(av) )
            {
                if (av->value != NULL)
                {
                    HasAlt = yes;
                }
            }
        }

        if (HasAlt == no)
        {
            /* Must have alternate text representation for that element */
            if (node->content != NULL) 
            {
                ctmbstr word = NULL;

                if ( node->content->tag == NULL )
                    word = textFromOneNode( doc, node->content);

                if ( node->content->content != NULL &&
                     node->content->content->tag == NULL )
                {
                    word = textFromOneNode( doc, node->content->content);
                }
                
                if ( word != NULL && !IsWhitespace(word) )
                    HasDescription = yes;
            }
        }

        if ( !HasDescription && !HasAlt )
        {
            TY_(ReportAccessError)( doc, node, APPLET_MISSING_ALT );
        }
    }
}